

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O3

size_t portability_path_get_directory
                 (char *path,size_t path_size,char *absolute,size_t absolute_size)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  
  if (absolute == (char *)0x0 || path == (char *)0x0) {
    return 0;
  }
  if (path_size < absolute_size) {
    absolute_size = path_size;
  }
  cVar2 = *path;
  if (absolute_size == 0 || cVar2 == '\0') {
    uVar1 = 0;
  }
  else {
    uVar3 = 1;
    uVar1 = 0;
    do {
      absolute[uVar3 - 1] = cVar2;
      if (path[uVar3 - 1] == '/') {
        uVar1 = uVar3;
      }
      if (absolute_size <= uVar3) break;
      cVar2 = path[uVar3];
      uVar3 = uVar3 + 1;
    } while (cVar2 != '\0');
  }
  absolute[uVar1] = '\0';
  return uVar1 + 1;
}

Assistant:

size_t portability_path_get_directory(const char *path, size_t path_size, char *absolute, size_t absolute_size)
{
	if (path == NULL || absolute == NULL)
	{
		return 0;
	}

	size_t i, last, size = path_size < absolute_size ? path_size : absolute_size;

	for (i = 0, last = 0; path[i] != '\0' && i < size; ++i)
	{
		absolute[i] = path[i];

		if (PORTABILITY_PATH_SEPARATOR(path[i]))
		{
			last = i + 1;
		}
	}

	absolute[last] = '\0';

	return last + 1;
}